

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_decoded_utf8_stats *
rf_count_utf8_chars(rf_decoded_utf8_stats *__return_storage_ptr__,char *text,rf_int len)

{
  bool bVar1;
  rf_int rVar2;
  long lVar3;
  long lVar4;
  rf_int rVar5;
  rf_int rVar6;
  long lVar7;
  rf_decoded_rune decoded_rune;
  rf_decoded_rune local_48;
  
  __return_storage_ptr__->valid_rune_count = 0;
  __return_storage_ptr__->total_rune_count = 0;
  __return_storage_ptr__->bytes_processed = 0;
  __return_storage_ptr__->invalid_bytes = 0;
  if (0 < len && text != (char *)0x0) {
    rVar5 = __return_storage_ptr__->bytes_processed;
    lVar3 = __return_storage_ptr__->invalid_bytes;
    lVar4 = __return_storage_ptr__->valid_rune_count;
    rVar6 = __return_storage_ptr__->total_rune_count;
    do {
      rf_decode_utf8_char(&local_48,text,len);
      text = text + local_48.bytes_processed;
      rVar5 = rVar5 + local_48.bytes_processed;
      rVar2 = local_48.bytes_processed;
      if ((ulong)local_48.valid != 0) {
        rVar2 = 0;
      }
      lVar3 = lVar3 + rVar2;
      lVar4 = lVar4 + (ulong)local_48.valid;
      rVar6 = rVar6 + 1;
      lVar7 = len - local_48.bytes_processed;
      bVar1 = local_48.bytes_processed <= len;
      len = lVar7;
    } while (lVar7 != 0 && bVar1);
    __return_storage_ptr__->bytes_processed = rVar5;
    __return_storage_ptr__->invalid_bytes = lVar3;
    __return_storage_ptr__->valid_rune_count = lVar4;
    __return_storage_ptr__->total_rune_count = rVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_decoded_utf8_stats rf_count_utf8_chars(const char* text, rf_int len)
{
    rf_decoded_utf8_stats result = {0};

    if (text && len > 0)
    {
        while (len > 0)
        {
            rf_decoded_rune decoded_rune = rf_decode_utf8_char(text, len);

            text += decoded_rune.bytes_processed;
            len  -= decoded_rune.bytes_processed;

            result.bytes_processed  += decoded_rune.bytes_processed;
            result.invalid_bytes    += decoded_rune.valid ? 0 : decoded_rune.bytes_processed;
            result.valid_rune_count += decoded_rune.valid ? 1 : 0;
            result.total_rune_count += 1;
        }
    }

    return result;
}